

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong __thiscall mkvparser::CuePoint::GetTime(CuePoint *this,Segment *pSegment)

{
  long lVar1;
  
  if (pSegment == (Segment *)0x0) {
    __assert_fail("pSegment",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9a3,"long long mkvparser::CuePoint::GetTime(const Segment *) const");
  }
  if (this->m_timecode < 0) {
    __assert_fail("m_timecode >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9a4,"long long mkvparser::CuePoint::GetTime(const Segment *) const");
  }
  if (pSegment->m_pInfo == (SegmentInfo *)0x0) {
    __assert_fail("pInfo",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x9a7,"long long mkvparser::CuePoint::GetTime(const Segment *) const");
  }
  lVar1 = pSegment->m_pInfo->m_timecodeScale;
  if (0 < lVar1) {
    return lVar1 * this->m_timecode;
  }
  __assert_fail("scale >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                ,0x9aa,"long long mkvparser::CuePoint::GetTime(const Segment *) const");
}

Assistant:

long long CuePoint::GetTime(const Segment* pSegment) const {
  assert(pSegment);
  assert(m_timecode >= 0);

  const SegmentInfo* const pInfo = pSegment->GetInfo();
  assert(pInfo);

  const long long scale = pInfo->GetTimeCodeScale();
  assert(scale >= 1);

  const long long time = scale * m_timecode;

  return time;
}